

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

bool __thiscall cmMakefile::IsSet(cmMakefile *this,string *name)

{
  bool bVar1;
  char *pcVar2;
  
  pcVar2 = GetDefinition(this,name);
  if ((pcVar2 == (char *)0x0) || (*pcVar2 == '\0')) {
    bVar1 = false;
  }
  else {
    bVar1 = cmSystemTools::IsNOTFOUND((char *)0x1a15fe);
    bVar1 = !bVar1;
  }
  return bVar1;
}

Assistant:

bool cmMakefile::IsSet(const std::string& name) const
{
  const char* value = this->GetDefinition(name);
  if (!value) {
    return false;
  }

  if (!*value) {
    return false;
  }

  if (cmSystemTools::IsNOTFOUND(value)) {
    return false;
  }

  return true;
}